

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  undefined3 in_register_00000011;
  float fVar4;
  float fVar5;
  ImRect IVar6;
  ImRect rect_clipped;
  ImRect rect_for_touch;
  ImRect local_30;
  ImRect local_20;
  
  pIVar2 = GImGui;
  local_30.Min = *r_min;
  local_30.Max = *r_max;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    ImRect::ClipWith(&local_30,&GImGui->CurrentWindow->ClipRect);
  }
  IVar1 = (pIVar2->Style).TouchExtraPadding;
  fVar4 = IVar1.x;
  local_20.Min.x = local_30.Min.x - fVar4;
  fVar5 = IVar1.y;
  local_20.Min.y = local_30.Min.y - fVar5;
  local_20.Max.x = local_30.Max.x + fVar4;
  local_20.Max.y = local_30.Max.y + fVar5;
  bVar3 = ImRect::Contains(&local_20,&(pIVar2->IO).MousePos);
  if (bVar3) {
    IVar6 = ImGuiViewportP::GetMainRect(pIVar2->MouseViewport);
    bVar3 = false;
    if (local_30.Min.y < IVar6.Max.y) {
      bVar3 = false;
      if ((IVar6.Min.y < local_30.Max.y) && (local_30.Min.x < IVar6.Max.x)) {
        bVar3 = IVar6.Min.x < local_30.Max.x;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    if (!g.MouseViewport->GetMainRect().Overlaps(rect_clipped))
        return false;
    return true;
}